

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int load_private_key(EC_KEY **priv_key,uint8_t *bytes_key)

{
  int iVar1;
  EC_KEY *pEVar2;
  long in_FS_OFFSET;
  int status;
  uint8_t *bytes_key_local;
  EC_KEY **priv_key_local;
  uint8_t *local_18;
  char *p;
  
  p = *(char **)(in_FS_OFFSET + 0x28);
  *priv_key = (EC_KEY *)0x0;
  local_18 = bytes_key;
  pEVar2 = d2i_ECPrivateKey((EC_KEY **)0x0,&local_18,0x79);
  *priv_key = (EC_KEY *)pEVar2;
  if (*priv_key == (EC_KEY *)0x0) {
    priv_key_local._4_4_ = -3;
  }
  else {
    iVar1 = EC_KEY_check_key((EC_KEY *)*priv_key);
    if (iVar1 == 0) {
      EC_KEY_free((EC_KEY *)*priv_key);
      *priv_key = (EC_KEY *)0x0;
      priv_key_local._4_4_ = -3;
    }
    else {
      priv_key_local._4_4_ = 0;
    }
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == p) {
    return priv_key_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int load_private_key(EC_KEY **priv_key, uint8_t *bytes_key)
{
	int status = 0;
	char *p = (char *)bytes_key;
	*priv_key = NULL;

	/* The private key copying is similar to the public key
	 * copying, except that the private key is returned directly
	 * as an EC_KEY.
	 */
	*priv_key = d2i_ECPrivateKey(NULL, (const unsigned char **)&p, (long)PRIVATE_KEY_LENGTH);

	if (!*priv_key)
		return RTR_BGPSEC_LOAD_PRIV_KEY_ERROR;

	status = EC_KEY_check_key(*priv_key);
	if (status == 0) {
		EC_KEY_free(*priv_key);
		*priv_key = NULL;
		return RTR_BGPSEC_LOAD_PRIV_KEY_ERROR;
	}

	return RTR_BGPSEC_SUCCESS;
}